

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

NodeSequence __thiscall
GraphBuilder::buildGeneralCallInstruction(GraphBuilder *this,CallInst *callInstruction)

{
  Function *pFVar1;
  CallInst *in_RDI;
  CallNode *callNode;
  GraphBuilder *in_stack_00000028;
  CallInst *in_stack_ffffffffffffffc8;
  CallBase *in_stack_ffffffffffffffd8;
  NodeSequence local_10;
  
  pFVar1 = llvm::CallBase::getCalledFunction(in_stack_ffffffffffffffd8);
  if (pFVar1 == (Function *)0x0) {
    createNode<(NodeType)7,decltype(nullptr),llvm::CallInst_const*>
              (in_RDI,in_stack_ffffffffffffffc8);
    addNode<CallNode>(in_stack_00000028,(CallNode *)this);
  }
  else {
    createNode<(NodeType)7,llvm::CallInst_const*>(in_RDI);
    addNode<CallNode>(in_stack_00000028,(CallNode *)this);
  }
  std::pair<Node_*,_Node_*>::pair<CallNode_*&,_CallNode_*&,_true>
            (&local_10,(CallNode **)&stack0xffffffffffffffd8,(CallNode **)&stack0xffffffffffffffd8);
  return local_10;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::buildGeneralCallInstruction(const CallInst *callInstruction) {
    CallNode *callNode;
    if (callInstruction->getCalledFunction()) {
        callNode = addNode(createNode<NodeType::CALL>(callInstruction));
    } else {
        callNode =
                addNode(createNode<NodeType::CALL>(nullptr, callInstruction));
    }
    return {callNode, callNode};
}